

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualsource.cpp
# Opt level: O3

double __thiscall QualSource::getQuality(QualSource *this,Node *node)

{
  double dVar1;
  int iVar2;
  double dVar3;
  
  dVar3 = node->quality;
  this->quality = dVar3;
  dVar1 = this->outflow;
  if ((dVar1 == 0.0) && (!NAN(dVar1))) {
    return dVar3;
  }
  switch(this->type) {
  case 0:
    iVar2 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar2 == 0) {
      if (0.0 <= node->outflow) {
        return this->quality;
      }
      dVar3 = this->quality - (node->outflow / this->outflow) * this->strength;
    }
    else if (iVar2 == 1) {
      dVar3 = this->strength;
      if (this->strength <= this->quality) {
        dVar3 = this->quality;
      }
    }
    else {
      if (iVar2 != 2) {
        return this->quality;
      }
      dVar3 = this->strength;
    }
    break;
  case 1:
    dVar3 = dVar3 + this->strength / dVar1;
    break;
  case 2:
    dVar3 = dVar3 + this->strength;
    break;
  case 3:
    dVar1 = this->strength;
    if (this->strength <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = dVar1;
    this->quality = dVar3;
  default:
    goto switchD_0012ea9f_default;
  }
  this->quality = dVar3;
switchD_0012ea9f_default:
  return dVar3;
}

Assistant:

double QualSource::getQuality(Node* node)
{
    // ... no source contribution if no flow out of node
    quality = node->quality;
    if ( outflow == 0.0 ) return quality;

    switch (type)
    {
    case CONCEN:
        switch (node->type())
        {
        // ... for junctions, outflow quality is the node's quality plus the
        //     source's quality times the fraction of outflow to the network
        //     contributed by external inflow (i.e., negative demand)
        //     NOTE: qualSource.outflow is flow in links leaving the node,
        //           node->outflow is node's external outflow (demands, etc.)
        case Node::JUNCTION:
            if ( node->outflow < 0.0 )
            {
                quality += strength * (-node->outflow / outflow);
            }
            break;

        // ... for tanks, the outflow quality is the larger of the
        //     tank's value and the source's value
        case Node::TANK:
            quality = max(quality, strength);
            break;

        // ... for reservoirs, outflow quality equals the source strength
        case Node::RESERVOIR:
            quality = strength;
            break;
        }
        break;

    case MASS:
        // ... outflow quality is node's quality plus the source's
        //     mass flow rate divided by the node's outflow to the network
        quality += strength / outflow;
        break;

    case SETPOINT:
        // ... outflow quality is larger of node quality and setpoint strength
         quality = max(quality, strength);
        break;

    case FLOWPACED:
        // ... outflow quality is node's quality + source's strength
        quality += strength;
        break;
    }
    return quality;
}